

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSchemaValidateFacetWhtsp(void)

{
  int iVar1;
  xmlSchemaWhitespaceValueType val_00;
  xmlSchemaValType val_01;
  xmlSchemaWhitespaceValueType val_02;
  int iVar2;
  xmlChar *val_03;
  uint local_5c;
  int n_ws;
  xmlSchemaWhitespaceValueType ws;
  int n_val;
  xmlSchemaValPtr val;
  int n_value;
  xmlChar *value;
  int n_valType;
  xmlSchemaValType valType;
  int n_fws;
  xmlSchemaWhitespaceValueType fws;
  int n_facet;
  xmlSchemaFacetPtr facet;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_fws = 0; n_fws < 1; n_fws = n_fws + 1) {
    for (n_valType = 0; n_valType < 4; n_valType = n_valType + 1) {
      for (value._4_4_ = 0; (int)value._4_4_ < 4; value._4_4_ = value._4_4_ + 1) {
        for (val._4_4_ = 0; (int)val._4_4_ < 5; val._4_4_ = val._4_4_ + 1) {
          for (n_ws = 0; n_ws < 1; n_ws = n_ws + 1) {
            for (local_5c = 0; (int)local_5c < 4; local_5c = local_5c + 1) {
              iVar1 = xmlMemBlocks();
              val_00 = gen_xmlSchemaWhitespaceValueType(n_valType,1);
              val_01 = gen_xmlSchemaValType(value._4_4_,2);
              val_03 = gen_const_xmlChar_ptr(val._4_4_,3);
              val_02 = gen_xmlSchemaWhitespaceValueType(local_5c,5);
              iVar2 = xmlSchemaValidateFacetWhtsp(0,val_00,val_01,val_03,0,val_02);
              desret_int(iVar2);
              call_tests = call_tests + 1;
              des_xmlSchemaWhitespaceValueType(n_valType,val_00,1);
              des_xmlSchemaValType(value._4_4_,val_01,2);
              des_const_xmlChar_ptr(val._4_4_,val_03,3);
              des_xmlSchemaWhitespaceValueType(local_5c,val_02,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSchemaValidateFacetWhtsp",
                       (ulong)(uint)(iVar2 - iVar1));
                ret_val = ret_val + 1;
                printf(" %d",(ulong)(uint)n_fws);
                printf(" %d",(ulong)(uint)n_valType);
                printf(" %d",(ulong)value._4_4_);
                printf(" %d",(ulong)val._4_4_);
                printf(" %d",(ulong)(uint)n_ws);
                printf(" %d",(ulong)local_5c);
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSchemaValidateFacetWhtsp(void) {
    int test_ret = 0;

#if defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlSchemaFacetPtr facet; /* the facet to check */
    int n_facet;
    xmlSchemaWhitespaceValueType fws; /* the whitespace type of the facet's value */
    int n_fws;
    xmlSchemaValType valType; /* the built-in type of the value */
    int n_valType;
    const xmlChar * value; /* the lexical (or normalized for pattern) repr of the value to validate */
    int n_value;
    xmlSchemaValPtr val; /* the precomputed value */
    int n_val;
    xmlSchemaWhitespaceValueType ws; /* the whitespace type of the value */
    int n_ws;

    for (n_facet = 0;n_facet < gen_nb_xmlSchemaFacetPtr;n_facet++) {
    for (n_fws = 0;n_fws < gen_nb_xmlSchemaWhitespaceValueType;n_fws++) {
    for (n_valType = 0;n_valType < gen_nb_xmlSchemaValType;n_valType++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
    for (n_val = 0;n_val < gen_nb_xmlSchemaValPtr;n_val++) {
    for (n_ws = 0;n_ws < gen_nb_xmlSchemaWhitespaceValueType;n_ws++) {
        mem_base = xmlMemBlocks();
        facet = gen_xmlSchemaFacetPtr(n_facet, 0);
        fws = gen_xmlSchemaWhitespaceValueType(n_fws, 1);
        valType = gen_xmlSchemaValType(n_valType, 2);
        value = gen_const_xmlChar_ptr(n_value, 3);
        val = gen_xmlSchemaValPtr(n_val, 4);
        ws = gen_xmlSchemaWhitespaceValueType(n_ws, 5);

        ret_val = xmlSchemaValidateFacetWhtsp(facet, fws, valType, value, val, ws);
        desret_int(ret_val);
        call_tests++;
        des_xmlSchemaFacetPtr(n_facet, facet, 0);
        des_xmlSchemaWhitespaceValueType(n_fws, fws, 1);
        des_xmlSchemaValType(n_valType, valType, 2);
        des_const_xmlChar_ptr(n_value, value, 3);
        des_xmlSchemaValPtr(n_val, val, 4);
        des_xmlSchemaWhitespaceValueType(n_ws, ws, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSchemaValidateFacetWhtsp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_facet);
            printf(" %d", n_fws);
            printf(" %d", n_valType);
            printf(" %d", n_value);
            printf(" %d", n_val);
            printf(" %d", n_ws);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}